

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O1

void reset_oattached_mids(boolean ghostly,level *lev)

{
  byte *pbVar1;
  uint uVar2;
  boolean bVar3;
  obj *poVar4;
  uint nid;
  uint local_2c;
  
  poVar4 = lev->objlist;
  if (poVar4 != (obj *)0x0) {
    do {
      if (ghostly != '\0') {
        if (((*(uint *)&poVar4->field_0x4a & 0x600000) == 0x200000) && (poVar4->oxlth != 0)) {
          *(undefined4 *)((long)&poVar4[1].olev + 4) = 0;
          *(undefined1 *)&poVar4[1].oeaten = 0;
          pbVar1 = (byte *)((long)&poVar4[1].age + 2);
          *pbVar1 = *pbVar1 & 0xbf;
        }
        uVar2 = *(uint *)&poVar4->field_0x4a;
        if ((uVar2 & 0x600000) == 0x400000) {
          bVar3 = lookup_id_mapping(poVar4->oextra[0],&local_2c);
          if (bVar3 == '\0') {
            *(uint *)&poVar4->field_0x4a = uVar2 & 0xff9fffff;
          }
          else {
            poVar4->oextra[0] = local_2c;
          }
        }
      }
      poVar4 = poVar4->nobj;
    } while (poVar4 != (obj *)0x0);
  }
  return;
}

Assistant:

static void reset_oattached_mids(boolean ghostly, struct level *lev)
{
    struct obj *otmp;
    unsigned oldid, nid;
    for (otmp = lev->objlist; otmp; otmp = otmp->nobj) {
	if (ghostly && otmp->oattached == OATTACHED_MONST && otmp->oxlth) {
	    struct monst *mtmp = (struct monst *)otmp->oextra;

	    mtmp->m_id = 0;
	    mtmp->mpeaceful = mtmp->mtame = 0;	/* pet's owner died! */
	}
	if (ghostly && otmp->oattached == OATTACHED_M_ID) {
	    memcpy(&oldid, (void *)otmp->oextra, sizeof(oldid));
	    if (lookup_id_mapping(oldid, &nid))
		memcpy(otmp->oextra, (void *)&nid, sizeof(nid));
	    else
		otmp->oattached = OATTACHED_NOTHING;
	}
    }
}